

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O1

TRUST_TOKEN_METHOD * TRUST_TOKEN_experiment_v1(void)

{
  return &TRUST_TOKEN_experiment_v1::kMethod;
}

Assistant:

const TRUST_TOKEN_METHOD *TRUST_TOKEN_experiment_v1(void) {
  static const TRUST_TOKEN_METHOD kMethod = {
      pmbtoken_exp1_generate_key,
      pmbtoken_exp1_derive_key_from_secret,
      pmbtoken_exp1_client_key_from_bytes,
      pmbtoken_exp1_issuer_key_from_bytes,
      pmbtoken_exp1_blind,
      pmbtoken_exp1_sign,
      pmbtoken_exp1_unblind,
      pmbtoken_exp1_read,
      1, /* has_private_metadata */
      3, /* max_keys */
      1, /* has_srr */
  };
  return &kMethod;
}